

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keyevent.c
# Opt level: O1

void cursor_hidden_bitmap(int x,int y)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  byte bVar7;
  byte bVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  int iVar14;
  uint uVar15;
  uint *puVar16;
  uint uVar17;
  uint *puVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  uint *local_58;
  uint *local_50;
  
  uVar4 = displaywidth;
  uVar12 = displaywidth + 0xf;
  if (-1 < (int)displaywidth) {
    uVar12 = displaywidth;
  }
  iVar2 = displaywidth - x;
  if (x + 0x10 <= (int)displaywidth) {
    iVar2 = 0x10;
  }
  LastCursorClippingY = displayheight - y;
  if (y + 0x10 <= (int)displayheight) {
    LastCursorClippingY = 0x10;
  }
  uVar10 = iVar2 - 1U & 0x1f;
  uVar20 = -1 << (~(byte)uVar10 & 0x1f);
  if (x < 0) {
    uVar6 = -(ulong)(7U - x >> 3);
  }
  else {
    uVar6 = (ulong)((uint)x >> 3);
  }
  uVar6 = (long)DisplayRegion68k + uVar6 + (long)(((int)uVar12 >> 4) * y) * 2;
  LastCursorClippingX = iVar2;
  if (0 < LastCursorClippingY) {
    local_58 = (uint *)(uVar6 & 0xfffffffffffffffc);
    uVar12 = (x & 7U) + ((uint)uVar6 & 3) * 8;
    iVar5 = -uVar12;
    uVar15 = 0xffffffff;
    uVar19 = 0;
    uVar9 = -(uint)(uVar12 == 0) | ~(-1 << ((byte)uVar12 & 0x1f));
    local_50 = (uint *)MonoCursor_savebitmap;
    uVar13 = 0;
    uVar11 = uVar20;
    iVar3 = LastCursorClippingY;
    iVar14 = iVar2;
    uVar17 = uVar12;
    uVar21 = uVar12;
    do {
      bVar7 = (byte)iVar5 & 0x1f;
      bVar8 = (byte)uVar12;
      if (uVar13 < uVar17) {
        if (0x20 < (int)(iVar2 + uVar17)) {
          puVar18 = local_58 + 2;
          uVar19 = local_58[1] << (bVar8 & 0x1f);
          uVar12 = local_58[1] >> bVar7 & uVar9 | *local_58 << (bVar8 & 0x1f);
          goto LAB_0012992f;
        }
        if (uVar17 <= uVar13) goto LAB_00129915;
        puVar18 = local_58 + 1;
        uVar12 = *local_58 << (bVar8 & 0x1f);
      }
      else {
LAB_00129915:
        puVar18 = local_58 + 1;
        uVar19 = *local_58 << (bVar8 & 0x1f);
        uVar12 = *local_58 >> bVar7 & uVar9;
LAB_0012992f:
        uVar19 = ~uVar9 & uVar19;
      }
      puVar16 = local_50;
      if ((int)(iVar2 + uVar13) < 0x21) {
LAB_00129953:
        *puVar16 = (uVar12 ^ *puVar16) & uVar20 ^ *puVar16;
      }
      else {
        iVar14 = iVar14 >> 5;
        *local_50 = (uVar12 ^ *local_50) & uVar15 ^ *local_50;
        puVar16 = local_50 + 1;
        if (uVar17 == uVar13) {
          for (; 1 < iVar14; iVar14 = iVar14 + -1) {
            uVar12 = *puVar18;
            puVar18 = puVar18 + 1;
            *puVar16 = uVar12;
            puVar16 = puVar16 + 1;
          }
        }
        else {
          for (; 1 < iVar14; iVar14 = iVar14 + -1) {
            uVar12 = *puVar18;
            puVar18 = puVar18 + 1;
            uVar20 = uVar12 >> bVar7 | uVar19;
            uVar19 = uVar12 << (bVar8 & 0x1f);
            *puVar16 = uVar20;
            puVar16 = puVar16 + 1;
          }
        }
        if (uVar10 != 0x1f) {
          uVar20 = uVar11;
          uVar12 = uVar19;
          if (((iVar2 + uVar21) - 1 & 0x1f) <= uVar10) {
            uVar12 = *puVar18 >> bVar7 & uVar9 | uVar19;
          }
          goto LAB_00129953;
        }
      }
      uVar12 = uVar13 + 0x10;
      local_50 = local_50 + (uVar12 >> 5);
      uVar13 = uVar12 & 0x1f;
      uVar10 = (iVar2 + uVar13) - 1 & 0x1f;
      uVar15 = -(uint)(uVar13 == 0) | ~(-1 << (-(char)uVar13 & 0x1fU));
      uVar11 = -1 << (~(byte)uVar10 & 0x1f);
      uVar20 = uVar11 & uVar15;
      uVar21 = uVar17 + uVar4;
      iVar5 = uVar13 - uVar21;
      uVar12 = uVar21 - uVar12 & 0x1f;
      local_58 = local_58 + ((int)uVar21 >> 5);
      uVar17 = uVar21 & 0x1f;
      uVar9 = -(uint)(uVar12 == 0) | ~(-1 << (sbyte)uVar12);
      iVar14 = iVar2 + uVar13;
      bVar1 = 1 < iVar3;
      iVar3 = iVar3 + -1;
    } while (bVar1);
  }
  return;
}

Assistant:

void cursor_hidden_bitmap(int x, int y)
{
  DLword *srcbase, *dstbase;
  static int sx, dx, w, h, srcbpl, dstbpl, backwardflg = 0;
  static int src_comp = 0, op = 0, gray = 0, num_gray = 0, curr_gray_line = 0;
  /* save image */
  srcbase = DisplayRegion68k + (y * DLWORD_PERLINE);
  dstbase = MonoCursor_savebitmap;
  sx = x;
  dx = 0;
  CursorClippingX(x, w); /* w and LastCursorClippingX rest */
  CursorClippingY(y, h); /* h and LastCursorClippingY reset */
  srcbpl = displaywidth;
  dstbpl = HARD_CURSORWIDTH;
  op = 0; /* replace */
  new_bitblt_code;
}